

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gltf.cpp
# Opt level: O1

Material * vera::extractMaterial(Model *_model,Material *_material,Scene *_scene,bool _verbose)

{
  pointer *ppdVar1;
  double dVar2;
  uint8_t *_array3D;
  pointer pIVar3;
  size_t __n;
  pointer pIVar4;
  pointer puVar5;
  Model *pMVar6;
  int iVar7;
  int iVar8;
  iterator iVar9;
  mapped_type *ppMVar10;
  mapped_type this;
  long *plVar11;
  long lVar12;
  ostream *poVar13;
  pointer pIVar14;
  iterator iVar15;
  Texture *pTVar16;
  mapped_type *ppTVar17;
  Image *this_00;
  undefined8 uVar18;
  undefined7 in_register_00000009;
  size_type *psVar19;
  pointer pdVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  undefined7 uVar22;
  _Alloc_hider _Var23;
  vector<double,_std::allocator<double>_> c;
  int iStack_1a4;
  undefined1 local_1a0 [8];
  undefined8 local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  undefined4 local_17c;
  Model *local_178;
  string mat_name;
  string name;
  int local_12c;
  _Alloc_hider local_118;
  char local_108 [16];
  pointer local_f8;
  vector<tinygltf::Value,_std::allocator<tinygltf::Value>_> local_e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
  local_c8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
  local_90;
  string *local_60;
  string local_58;
  int local_34;
  
  local_17c = (undefined4)CONCAT71(in_register_00000009,_verbose);
  local_178 = _model;
  purifyString((string *)&c,&_material->name);
  toUnderscore(&name,(string *)&c);
  toLower(&mat_name,&name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name._M_dataplus._M_p != &name.field_2) {
    operator_delete(name._M_dataplus._M_p);
  }
  if ((pointer *)
      c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      != &c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
    operator_delete(c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  iVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>_>
          ::find(&(_scene->materials)._M_t,&mat_name);
  if ((_Rb_tree_header *)iVar9._M_node != &(_scene->materials)._M_t._M_impl.super__Rb_tree_header) {
    ppMVar10 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>_>
               ::operator[](&_scene->materials,&mat_name);
    this = *ppMVar10;
    goto LAB_0029305b;
  }
  this = (mapped_type)operator_new(0x150);
  Material::Material(this,&mat_name);
  toUpper((string *)&c,&this->name);
  plVar11 = (long *)std::__cxx11::string::replace((ulong)&c,0,(char *)0x0,0x2f6ed0);
  name._M_dataplus._M_p = (pointer)&name.field_2;
  psVar19 = (size_type *)(plVar11 + 2);
  if ((size_type *)*plVar11 == psVar19) {
    name.field_2._M_allocated_capacity = *psVar19;
    name.field_2._8_4_ = (undefined4)plVar11[3];
    name.field_2._12_4_ = *(undefined4 *)((long)plVar11 + 0x1c);
  }
  else {
    name.field_2._M_allocated_capacity = *psVar19;
    name._M_dataplus._M_p = (pointer)*plVar11;
  }
  name._M_string_length = plVar11[1];
  *plVar11 = (long)psVar19;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  local_1a0 = (undefined1  [8])&local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"");
  (*(this->super_HaveDefines)._vptr_HaveDefines[10])(this,&name,local_1a0);
  if (local_1a0 != (undefined1  [8])&local_190) {
    operator_delete((void *)local_1a0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name._M_dataplus._M_p != &name.field_2) {
    operator_delete(name._M_dataplus._M_p);
  }
  if ((pointer *)
      c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      != &c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
    operator_delete(c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  name._M_dataplus._M_p = (pointer)&name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&name,"MATERIAL_BASECOLOR","");
  (*(this->super_HaveDefines)._vptr_HaveDefines[9])
            (this,&name,
             (_material->pbrMetallicRoughness).baseColorFactor.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start,4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name._M_dataplus._M_p != &name.field_2) {
    operator_delete(name._M_dataplus._M_p);
  }
  lVar12 = (long)(_material->pbrMetallicRoughness).baseColorTexture.index;
  if (lVar12 < 0) {
    std::vector<double,_std::allocator<double>_>::vector
              (&c,&(_material->pbrMetallicRoughness).baseColorFactor);
    name._M_dataplus._M_p = (pointer)&name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&name,"diffuse","");
    local_1a0._4_4_ =
         (float)c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[1];
    local_1a0._0_4_ =
         (float)*c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
    local_198 = CONCAT44((float)c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start[3],
                         (float)c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start[2]);
    Material::set(this,&name,(vec4 *)local_1a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)name._M_dataplus._M_p != &name.field_2) {
      operator_delete(name._M_dataplus._M_p);
    }
    if (c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    iStack_1a4 = 0;
LAB_00293568:
    name._M_dataplus._M_p = (pointer)&name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&name,"MATERIAL_EMISSIVE","");
    (*(this->super_HaveDefines)._vptr_HaveDefines[9])
              (this,&name,
               (_material->emissiveFactor).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start,3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)name._M_dataplus._M_p != &name.field_2) {
      operator_delete(name._M_dataplus._M_p);
    }
    lVar12 = (long)(_material->emissiveTexture).index;
    if (lVar12 < 0) {
      std::vector<double,_std::allocator<double>_>::vector(&c,&_material->emissiveFactor);
      name._M_dataplus._M_p = (pointer)&name.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&name,"emissive","");
      local_1a0._4_4_ =
           (float)c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[1];
      local_1a0._0_4_ =
           (float)*c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
      local_198 = CONCAT44(local_198._4_4_,
                           (float)c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start[2]);
      Material::set(this,&name,(vec3 *)local_1a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p);
      }
      _Var23._M_p = (pointer)c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
      if (c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
LAB_0029392c:
        operator_delete(_Var23._M_p);
      }
    }
    else {
      pIVar3 = (local_178->images).
               super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar8 = (local_178->textures).
              super__Vector_base<tinygltf::Texture,_std::allocator<tinygltf::Texture>_>._M_impl.
              super__Vector_impl_data._M_start[lVar12].source;
      pIVar14 = pIVar3 + iVar8;
      std::operator+(&name,&pIVar14->name,&pIVar3[iVar8].uri);
      if (name._M_string_length == 0) {
        local_58._M_dataplus._M_p._0_4_ = iStack_1a4;
        toString<int>((string *)local_1a0,(int *)&local_58);
        plVar11 = (long *)std::__cxx11::string::replace
                                    ((ulong)local_1a0,0,(char *)0x0,(ulong)mat_name._M_dataplus._M_p
                                    );
        ppdVar1 = &c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        pdVar20 = (pointer)(plVar11 + 2);
        if ((pointer)*plVar11 == pdVar20) {
          c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)*pdVar20;
          c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)ppdVar1;
        }
        else {
          c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)*pdVar20;
          c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)*plVar11;
        }
        c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)plVar11[1];
        *plVar11 = (long)pdVar20;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        std::__cxx11::string::operator=((string *)&name,(string *)&c);
        if ((pointer *)
            c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start != ppdVar1) {
          operator_delete(c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_1a0 != (undefined1  [8])&local_190) {
          operator_delete((void *)local_1a0);
        }
        iStack_1a4 = iStack_1a4 + 1;
      }
      getUniformName((string *)&c,&name);
      std::__cxx11::string::operator=((string *)&name,(string *)&c);
      if ((pointer *)
          c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          &c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage) {
        operator_delete(c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      this_00 = (Image *)operator_new(0x70);
      if (*(uint8_t **)((long)&pIVar14->image + 8) ==
          (uint8_t *)
          ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)&pIVar14->image)->_M_allocated_capacity) goto LAB_0029442e;
      Image::Image(this_00,(uint8_t *)
                           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)&pIVar14->image)->_M_allocated_capacity,pIVar14->width,
                   pIVar14->height,*(int *)&(((string *)&pIVar14->component)->_M_dataplus)._M_p);
      std::__cxx11::string::_M_assign((string *)&this_00->name);
      c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)&c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::_M_construct<char_const*>((string *)&c,"emissive","");
      Material::set(this,(string *)&c,this_00);
      if ((pointer *)
          c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          &c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage) {
        operator_delete(c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((char)local_17c != '\0') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Loading ",8);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,name._M_dataplus._M_p,name._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"for EMISSIVEMAP as ",0x13);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,name._M_dataplus._M_p,name._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
        std::ostream::put((char)poVar13);
        std::ostream::flush();
      }
      iVar15 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
               ::find(&(_scene->textures)._M_t,&name);
      if ((_Rb_tree_header *)iVar15._M_node ==
          &(_scene->textures)._M_t._M_impl.super__Rb_tree_header) {
        pTVar16 = (Texture *)operator_new(0x48);
        Texture::Texture(pTVar16,this_00,LINEAR,REPEAT);
        ppTVar17 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
                   ::operator[](&_scene->textures,&name);
        *ppTVar17 = pTVar16;
      }
      c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)&c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::_M_construct<char_const*>((string *)&c,"MATERIAL_EMISSIVEMAP","");
      (*(this->super_HaveDefines)._vptr_HaveDefines[10])(this,&c,&name);
      if ((pointer *)
          c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          &c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage) {
        operator_delete(c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      _Var23._M_p = name._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) goto LAB_0029392c;
    }
    name._M_dataplus._M_p = (pointer)&name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&name,"MATERIAL_ROUGHNESS","");
    (*(this->super_HaveDefines)._vptr_HaveDefines[4])
              (SUB84((_material->pbrMetallicRoughness).roughnessFactor,0),this,&name);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)name._M_dataplus._M_p != &name.field_2) {
      operator_delete(name._M_dataplus._M_p);
    }
    name._M_dataplus._M_p = (pointer)&name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&name,"MATERIAL_METALLIC","");
    (*(this->super_HaveDefines)._vptr_HaveDefines[4])
              (SUB84((_material->pbrMetallicRoughness).metallicFactor,0),this,&name);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)name._M_dataplus._M_p != &name.field_2) {
      operator_delete(name._M_dataplus._M_p);
    }
    pMVar6 = local_178;
    lVar12 = (long)(_material->pbrMetallicRoughness).metallicRoughnessTexture.index;
    if (lVar12 < 0) {
      pIVar14 = (pointer)0x0;
    }
    else {
      tinygltf::Texture::Texture
                ((Texture *)&name,
                 (local_178->textures).
                 super__Vector_base<tinygltf::Texture,_std::allocator<tinygltf::Texture>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar12);
      pIVar3 = (pMVar6->images).
               super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>._M_impl.
               super__Vector_impl_data._M_start;
      pIVar14 = pIVar3 + local_12c;
      local_60 = &pIVar3[local_12c].uri;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&c,
                     &pIVar14->name,local_60);
      if (c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish == (pointer)0x0) {
        local_34 = iStack_1a4;
        toString<int>(&local_58,&local_34);
        plVar11 = (long *)std::__cxx11::string::replace
                                    ((ulong)&local_58,0,(char *)0x0,(ulong)mat_name._M_dataplus._M_p
                                    );
        paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 == paVar21) {
          local_190._M_allocated_capacity = paVar21->_M_allocated_capacity;
          local_190._8_8_ = plVar11[3];
          local_1a0 = (undefined1  [8])&local_190;
        }
        else {
          local_190._M_allocated_capacity = paVar21->_M_allocated_capacity;
          local_1a0 = (undefined1  [8])*plVar11;
        }
        local_198 = plVar11[1];
        *plVar11 = (long)paVar21;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        std::__cxx11::string::operator=((string *)&c,(string *)local_1a0);
        if (local_1a0 != (undefined1  [8])&local_190) {
          operator_delete((void *)local_1a0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_58._M_dataplus._M_p._4_4_,(int)local_58._M_dataplus._M_p) !=
            &local_58.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_58._M_dataplus._M_p._4_4_,(int)local_58._M_dataplus._M_p));
        }
        iStack_1a4 = iStack_1a4 + 1;
      }
      getUniformName((string *)local_1a0,(string *)&c);
      std::__cxx11::string::operator=((string *)&c,(string *)local_1a0);
      if (local_1a0 != (undefined1  [8])&local_190) {
        operator_delete((void *)local_1a0);
      }
      if ((char)local_17c != '\0') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Loading ",8);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             (char *)c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start,
                             (long)c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_finish);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar13,"for METALLICROUGHNESSMAP as ",0x1c);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,(char *)c.super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_start,
                             (long)c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_finish);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
        std::ostream::put((char)poVar13);
        std::ostream::flush();
      }
      iVar15 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
               ::find(&(_scene->textures)._M_t,(key_type *)&c);
      if ((_Rb_tree_header *)iVar15._M_node ==
          &(_scene->textures)._M_t._M_impl.super__Rb_tree_header) {
        pTVar16 = (Texture *)operator_new(0x48);
        Texture::Texture(pTVar16);
        if (*(size_type *)((long)&pIVar14->image + 8) ==
            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)&pIVar14->image)->_M_allocated_capacity) goto LAB_00294440;
        (*pTVar16->_vptr_Texture[6])
                  (pTVar16,(ulong)(uint)pIVar14->width,(ulong)(uint)pIVar14->height,
                   (ulong)*(uint *)&(((string *)&pIVar14->component)->_M_dataplus)._M_p,
                   (ulong)(uint)pIVar14->bits,
                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)&pIVar14->image)->_M_allocated_capacity,0,0);
        ppTVar17 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
                   ::operator[](&_scene->textures,(key_type *)&c);
        *ppTVar17 = pTVar16;
      }
      lVar12 = (long)(_material->occlusionTexture).index;
      if (lVar12 < 0) {
LAB_00293caa:
        pIVar14 = (pointer)0x0;
      }
      else {
        pIVar3 = (local_178->images).
                 super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar8 = (local_178->textures).
                super__Vector_base<tinygltf::Texture,_std::allocator<tinygltf::Texture>_>._M_impl.
                super__Vector_impl_data._M_start[lVar12].source;
        iVar7 = std::__cxx11::string::compare((char *)local_60);
        if (iVar7 == 0) goto LAB_00293caa;
        __n = (pIVar14->uri)._M_string_length;
        if (__n != pIVar3[iVar8].uri._M_string_length) goto LAB_00293caa;
        uVar22 = (undefined7)((ulong)pIVar14 >> 8);
        if (__n == 0) {
          pIVar14 = (pointer)CONCAT71(uVar22,1);
        }
        else {
          iVar8 = bcmp((local_60->_M_dataplus)._M_p,pIVar3[iVar8].uri._M_dataplus._M_p,__n);
          pIVar14 = (pointer)CONCAT71(uVar22,iVar8 == 0);
        }
      }
      local_1a0 = (undefined1  [8])&local_190;
      if ((char)pIVar14 == '\0') {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a0,"MATERIAL_ROUGHNESSMETALLICMAP","");
        (*(this->super_HaveDefines)._vptr_HaveDefines[10])(this,local_1a0,&c);
        if (local_1a0 != (undefined1  [8])&local_190) {
LAB_00293d8f:
          operator_delete((void *)local_1a0);
        }
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a0,"MATERIAL_OCCLUSIONROUGHNESSMETALLICMAP","");
        (*(this->super_HaveDefines)._vptr_HaveDefines[10])(this,local_1a0,&c);
        if (local_1a0 != (undefined1  [8])&local_190) {
          operator_delete((void *)local_1a0);
        }
        dVar2 = (_material->occlusionTexture).strength;
        if ((dVar2 != 1.0) || (NAN(dVar2))) {
          local_1a0 = (undefined1  [8])&local_190;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a0,"MATERIAL_OCCLUSIONMAP_STRENGTH","");
          (*(this->super_HaveDefines)._vptr_HaveDefines[4])
                    (SUB84((_material->occlusionTexture).strength,0),this,local_1a0);
          if (local_1a0 != (undefined1  [8])&local_190) goto LAB_00293d8f;
        }
      }
      if ((pointer *)
          c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          &c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage) {
        operator_delete(c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
      ::~_Rb_tree(&local_90);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
      ::~_Rb_tree(&local_c8);
      std::vector<tinygltf::Value,_std::allocator<tinygltf::Value>_>::~vector(&local_e0);
      if (local_f8 != (pointer)0x0) {
        operator_delete(local_f8);
      }
      if (local_118._M_p != local_108) {
        operator_delete(local_118._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p);
      }
    }
    if (((char)pIVar14 == '\0') && (lVar12 = (long)(_material->occlusionTexture).index, -1 < lVar12)
       ) {
      pIVar4 = (local_178->images).
               super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar8 = (local_178->textures).
              super__Vector_base<tinygltf::Texture,_std::allocator<tinygltf::Texture>_>._M_impl.
              super__Vector_impl_data._M_start[lVar12].source;
      pIVar3 = pIVar4 + iVar8;
      std::operator+(&name,&pIVar3->name,&pIVar4[iVar8].uri);
      if (name._M_string_length == 0) {
        local_58._M_dataplus._M_p._0_4_ = iStack_1a4;
        toString<int>((string *)local_1a0,(int *)&local_58);
        plVar11 = (long *)std::__cxx11::string::replace
                                    ((ulong)local_1a0,0,(char *)0x0,(ulong)mat_name._M_dataplus._M_p
                                    );
        pIVar14 = (pointer)&c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage;
        pdVar20 = (pointer)(plVar11 + 2);
        if ((pointer)*plVar11 == pdVar20) {
          c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)*pdVar20;
          c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)pIVar14;
        }
        else {
          c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)*pdVar20;
          c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)*plVar11;
        }
        c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)plVar11[1];
        *plVar11 = (long)pdVar20;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        std::__cxx11::string::operator=((string *)&name,(string *)&c);
        if ((pointer)c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start != pIVar14) {
          operator_delete(c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_1a0 != (undefined1  [8])&local_190) {
          operator_delete((void *)local_1a0);
        }
        iStack_1a4 = iStack_1a4 + 1;
      }
      getUniformName((string *)&c,&name);
      std::__cxx11::string::operator=((string *)&name,(string *)&c);
      if ((pointer *)
          c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          &c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage) {
        operator_delete(c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((char)local_17c != '\0') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Loading ",8);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,name._M_dataplus._M_p,name._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"for OCCLUSIONMAP as ",0x14);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,name._M_dataplus._M_p,name._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
        std::ostream::put((char)poVar13);
        std::ostream::flush();
      }
      iVar15 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
               ::find(&(_scene->textures)._M_t,&name);
      if ((_Rb_tree_header *)iVar15._M_node ==
          &(_scene->textures)._M_t._M_impl.super__Rb_tree_header) {
        pIVar14 = (pointer)operator_new(0x48);
        Texture::Texture((Texture *)pIVar14);
        puVar5 = *(pointer *)
                  &(pIVar3->image).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
        ;
        if ((pIVar3->image).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish == puVar5) goto LAB_00294464;
        (**(_func_int **)((long)(pIVar14->name)._M_dataplus._M_p + 0x30))
                  (pIVar14,(ulong)(uint)pIVar3->width,(ulong)(uint)pIVar3->height,
                   (ulong)(uint)pIVar3->component,(ulong)(uint)pIVar3->bits,puVar5,0,0);
        ppTVar17 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
                   ::operator[](&_scene->textures,&name);
        *ppTVar17 = (mapped_type)pIVar14;
      }
      c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)&c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::_M_construct<char_const*>((string *)&c,"MATERIAL_OCCLUSIONMAP","");
      (*(this->super_HaveDefines)._vptr_HaveDefines[10])(this,&c,&name);
      if ((pointer *)
          c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          &c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage) {
        operator_delete(c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      dVar2 = (_material->occlusionTexture).strength;
      if ((dVar2 != 1.0) || (NAN(dVar2))) {
        c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)&c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&c,"MATERIAL_OCCLUSIONMAP_STRENGTH","");
        (*(this->super_HaveDefines)._vptr_HaveDefines[4])
                  (SUB84((_material->occlusionTexture).strength,0),this,&c);
        if ((pointer *)
            c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start !=
            &c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage) {
          operator_delete(c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p);
      }
    }
    lVar12 = (long)(_material->normalTexture).index;
    if (lVar12 < 0) goto LAB_0029305b;
    pIVar4 = (local_178->images).
             super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar8 = (local_178->textures).
            super__Vector_base<tinygltf::Texture,_std::allocator<tinygltf::Texture>_>._M_impl.
            super__Vector_impl_data._M_start[lVar12].source;
    pIVar3 = pIVar4 + iVar8;
    std::operator+(&name,&pIVar3->name,&pIVar4[iVar8].uri);
    if (name._M_string_length == 0) {
      local_58._M_dataplus._M_p._0_4_ = iStack_1a4;
      toString<int>((string *)local_1a0,(int *)&local_58);
      plVar11 = (long *)std::__cxx11::string::replace
                                  ((ulong)local_1a0,0,(char *)0x0,(ulong)mat_name._M_dataplus._M_p);
      pIVar14 = (pointer)&c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage;
      pdVar20 = (pointer)(plVar11 + 2);
      if ((pointer)*plVar11 == pdVar20) {
        c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)*pdVar20;
        c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)pIVar14;
      }
      else {
        c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)*pdVar20;
        c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)*plVar11;
      }
      c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)plVar11[1];
      *plVar11 = (long)pdVar20;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      std::__cxx11::string::operator=((string *)&name,(string *)&c);
      if ((pointer)c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start != pIVar14) {
        operator_delete(c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_1a0 != (undefined1  [8])&local_190) {
        operator_delete((void *)local_1a0);
      }
    }
    getUniformName((string *)&c,&name);
    std::__cxx11::string::operator=((string *)&name,(string *)&c);
    if ((pointer *)
        c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        &c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage) {
      operator_delete(c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((char)local_17c != '\0') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Loading ",8);
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,name._M_dataplus._M_p,name._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"for NORMALMAP as ",0x11);
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar13,name._M_dataplus._M_p,name._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
    }
    iVar15 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
             ::find(&(_scene->textures)._M_t,&name);
    if ((_Rb_tree_header *)iVar15._M_node == &(_scene->textures)._M_t._M_impl.super__Rb_tree_header)
    {
      pTVar16 = (Texture *)operator_new(0x48);
      Texture::Texture(pTVar16);
      puVar5 = *(pointer *)
                &(pIVar3->image).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>;
      if ((pIVar3->image).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish == puVar5) goto LAB_00294452;
      (*pTVar16->_vptr_Texture[6])
                (pTVar16,(ulong)(uint)pIVar3->width,(ulong)(uint)pIVar3->height,
                 (ulong)(uint)pIVar3->component,(ulong)(uint)pIVar3->bits,puVar5,0,0);
      ppTVar17 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
                 ::operator[](&_scene->textures,&name);
      *ppTVar17 = pTVar16;
    }
    c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)&c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::_M_construct<char_const*>((string *)&c,"MATERIAL_NORMALMAP","");
    (*(this->super_HaveDefines)._vptr_HaveDefines[10])(this,&c,&name);
    if ((pointer *)
        c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        &c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage) {
      operator_delete(c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    dVar2 = (_material->normalTexture).scale;
    if ((dVar2 != 1.0) || (NAN(dVar2))) {
      c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)&c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::_M_construct<char_const*>((string *)&c,"MATERIAL_NORMALMAP_SCALE","");
      (*(this->super_HaveDefines)._vptr_HaveDefines[6])
                ((float)(_material->normalTexture).scale,0x3f800000,this,&c);
      if ((pointer *)
          c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          &c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage) {
        operator_delete(c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)name._M_dataplus._M_p != &name.field_2) {
      operator_delete(name._M_dataplus._M_p);
    }
LAB_0029305b:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)mat_name._M_dataplus._M_p != &mat_name.field_2) {
      operator_delete(mat_name._M_dataplus._M_p);
    }
    return this;
  }
  pIVar14 = (local_178->images).
            super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar8 = (local_178->textures).
          super__Vector_base<tinygltf::Texture,_std::allocator<tinygltf::Texture>_>._M_impl.
          super__Vector_impl_data._M_start[lVar12].source;
  pIVar3 = pIVar14 + iVar8;
  std::operator+(&name,&pIVar3->name,&pIVar14[iVar8].uri);
  iStack_1a4 = 0;
  if (name._M_string_length == 0) {
    local_58._M_dataplus._M_p._0_4_ = 0;
    toString<int>((string *)local_1a0,(int *)&local_58);
    plVar11 = (long *)std::__cxx11::string::replace
                                ((ulong)local_1a0,0,(char *)0x0,(ulong)mat_name._M_dataplus._M_p);
    ppdVar1 = &c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
               ._M_end_of_storage;
    pdVar20 = (pointer)(plVar11 + 2);
    if ((pointer)*plVar11 == pdVar20) {
      c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)*pdVar20;
      c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)ppdVar1;
    }
    else {
      c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)*pdVar20;
      c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)*plVar11;
    }
    c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)plVar11[1];
    *plVar11 = (long)pdVar20;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    std::__cxx11::string::operator=((string *)&name,(string *)&c);
    if ((pointer *)
        c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start != ppdVar1) {
      operator_delete(c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_1a0 != (undefined1  [8])&local_190) {
      operator_delete((void *)local_1a0);
    }
    iStack_1a4 = 1;
  }
  getUniformName((string *)&c,&name);
  std::__cxx11::string::operator=((string *)&name,(string *)&c);
  if ((pointer *)
      c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      != &c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
    operator_delete(c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((char)local_17c != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Loading ",8);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,mat_name._M_dataplus._M_p,mat_name._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13," BASECOLORMAP as ",0x11);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar13,name._M_dataplus._M_p,name._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
  }
  pIVar14 = (pointer)operator_new(0x70);
  _array3D = *(uint8_t **)
              &(pIVar3->image).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>;
  if ((pIVar3->image).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != _array3D) {
    Image::Image((Image *)pIVar14,_array3D,pIVar3->width,pIVar3->height,pIVar3->component);
    std::__cxx11::string::_M_assign((string *)&(pIVar14->name)._M_string_length);
    c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)&c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::_M_construct<char_const*>((string *)&c,"diffuse","");
    Material::set(this,(string *)&c,(Image *)pIVar14);
    if ((pointer *)
        c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        &c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage) {
      operator_delete(c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    iVar15 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
             ::find(&(_scene->textures)._M_t,&name);
    if ((_Rb_tree_header *)iVar15._M_node == &(_scene->textures)._M_t._M_impl.super__Rb_tree_header)
    {
      pTVar16 = (Texture *)operator_new(0x48);
      Texture::Texture(pTVar16,(Image *)pIVar14,LINEAR,REPEAT);
      ppTVar17 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
                 ::operator[](&_scene->textures,&name);
      *ppTVar17 = pTVar16;
    }
    c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)&c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::_M_construct<char_const*>((string *)&c,"MATERIAL_BASECOLORMAP","");
    (*(this->super_HaveDefines)._vptr_HaveDefines[10])(this,&c,&name);
    if ((pointer *)
        c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        &c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage) {
      operator_delete(c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)name._M_dataplus._M_p != &name.field_2) {
      operator_delete(name._M_dataplus._M_p);
    }
    goto LAB_00293568;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_0029442e:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_00294440:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_00294452:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_00294464:
  uVar18 = std::__throw_out_of_range_fmt
                     ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,
                      0);
  operator_delete(pIVar14);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name._M_dataplus._M_p != &name.field_2) {
    operator_delete(name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)mat_name._M_dataplus._M_p != &mat_name.field_2) {
    operator_delete(mat_name._M_dataplus._M_p);
  }
  _Unwind_Resume(uVar18);
}

Assistant:

Material* extractMaterial(const tinygltf::Model& _model, const tinygltf::Material& _material, Scene* _scene, bool _verbose) {
    std::string mat_name = toLower( toUnderscore( purifyString( _material.name ) ) );

    if (_scene->materials.find(mat_name) != _scene->materials.end())
        return _scene->materials[mat_name];
        
    int texCounter = 0;
    Material* mat = new Material(mat_name);

    mat->addDefine("MATERIAL_NAME_" + toUpper(mat->name) );
    mat->addDefine("MATERIAL_BASECOLOR", (double*)_material.pbrMetallicRoughness.baseColorFactor.data(), 4);
    if (_material.pbrMetallicRoughness.baseColorTexture.index >= 0) {
        const tinygltf::Texture &tex = _model.textures[_material.pbrMetallicRoughness.baseColorTexture.index];
        const tinygltf::Image &image = _model.images[tex.source];
        std::string name = image.name + image.uri;
        if (name.empty())
            name = mat_name + toString(texCounter++);
        name = getUniformName(name);

        if (_verbose)
            std::cout << "Loading " << mat_name << " BASECOLORMAP as " << name << std::endl;

        Image* img = new Image(&image.image.at(0), image.width, image.height, image.component);
        img->name = name;
        mat->set("diffuse", img);

        if (_scene->textures.find(name) == _scene->textures.end())
            _scene->textures[name] = new Texture(img);

        mat->addDefine("MATERIAL_BASECOLORMAP", name);
    } 
    else {
        std::vector<double> c = _material.pbrMetallicRoughness.baseColorFactor;
        mat->set("diffuse", glm::vec4(float(c[0]), float(c[1]), float(c[2]), float(c[3])));
    }

    mat->addDefine("MATERIAL_EMISSIVE", (double*)_material.emissiveFactor.data(), 3);
    if (_material.emissiveTexture.index >= 0) {
        const tinygltf::Image &image = _model.images[_model.textures[_material.emissiveTexture.index].source];
        std::string name = image.name + image.uri;
        if (name.empty())
            name = mat_name + toString(texCounter++);
        name = getUniformName(name);

        Image* img = new Image(&image.image.at(0), image.width, image.height, image.component);
        img->name = name;
        mat->set("emissive", img);

        if (_verbose)
            std::cout << "Loading " << name << "for EMISSIVEMAP as " << name << std::endl;

        if (_scene->textures.find(name) == _scene->textures.end())
            _scene->textures[name] = new Texture(img);
        
        mat->addDefine("MATERIAL_EMISSIVEMAP", name);
    }
    else {
        std::vector<double> c = _material.emissiveFactor;
        mat->set("emissive", glm::vec3(float(c[0]), float(c[1]), float(c[2])));
    }

    bool isOcclusionRoughnessMetallic = false;
    mat->addDefine("MATERIAL_ROUGHNESS", _material.pbrMetallicRoughness.roughnessFactor);
    mat->addDefine("MATERIAL_METALLIC", _material.pbrMetallicRoughness.metallicFactor);
    if (_material.pbrMetallicRoughness.metallicRoughnessTexture.index >= 0) {
        tinygltf::Texture tex = _model.textures[_material.pbrMetallicRoughness.metallicRoughnessTexture.index];
        const tinygltf::Image &image = _model.images[tex.source];
        std::string name = image.name + image.uri;
        if (name.empty())
            name = mat_name + toString(texCounter++);
        name = getUniformName(name);

        if (_verbose)
            std::cout << "Loading " << name << "for METALLICROUGHNESSMAP as " << name << std::endl;

        if (_scene->textures.find(name) == _scene->textures.end()) {
            Texture* texture = new Texture();
            texture->load(image.width, image.height, image.component, image.bits, &image.image.at(0));
            _scene->textures[name] = texture;
        }

        if (_material.occlusionTexture.index >= 0) {
            const tinygltf::Image &occlussionImage = _model.images[_model.textures[_material.occlusionTexture.index].source];
            if (image.uri != "" && image.uri == occlussionImage.uri)
                isOcclusionRoughnessMetallic = true;
        }

        if (isOcclusionRoughnessMetallic) {
            mat->addDefine("MATERIAL_OCCLUSIONROUGHNESSMETALLICMAP", name);
            if (_material.occlusionTexture.strength != 1.0)
                mat->addDefine("MATERIAL_OCCLUSIONMAP_STRENGTH", _material.occlusionTexture.strength);
        }
        else
            mat->addDefine("MATERIAL_ROUGHNESSMETALLICMAP", name);
    }

     // OCCLUSION
    if (!isOcclusionRoughnessMetallic && _material.occlusionTexture.index >= 0) {
        const tinygltf::Image &image = _model.images[_model.textures[_material.occlusionTexture.index].source];
        std::string name = image.name + image.uri;
        if (name.empty())
            name = mat_name + toString(texCounter++);
        name = getUniformName(name);

        if (_verbose)
            std::cout << "Loading " << name << "for OCCLUSIONMAP as " << name << std::endl;

        if (_scene->textures.find(name) == _scene->textures.end()) {
            Texture* texture = new Texture();
            texture->load(image.width, image.height, image.component, image.bits, &image.image.at(0));
            _scene->textures[name] = texture;
        }
        mat->addDefine("MATERIAL_OCCLUSIONMAP", name);

        if (_material.occlusionTexture.strength != 1.0)
            mat->addDefine("MATERIAL_OCCLUSIONMAP_STRENGTH", _material.occlusionTexture.strength);
    }

    // NORMALMAP
    if (_material.normalTexture.index >= 0) {
        const tinygltf::Image &image = _model.images[_model.textures[_material.normalTexture.index].source];
        std::string name = image.name + image.uri;
        if (name.empty())
            name = mat_name + toString(texCounter++);
        name = getUniformName(name);

        if (_verbose)
            std::cout << "Loading " << name << "for NORMALMAP as " << name << std::endl;

        if (_scene->textures.find(name) == _scene->textures.end()) {
            Texture* texture = new Texture();
            texture->load(image.width, image.height, image.component, image.bits, &image.image.at(0));
            _scene->textures[name] = texture;
        }
        mat->addDefine("MATERIAL_NORMALMAP", name);

        if (_material.normalTexture.scale != 1.0)
            mat->addDefine("MATERIAL_NORMALMAP_SCALE", glm::vec3(_material.normalTexture.scale, _material.normalTexture.scale, 1.0));
    }

    return mat;
}